

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O3

Aig_Man_t * Ssw_SignalCorrespondenceRefine(Ssw_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Ssw_Sat_t *pSVar6;
  Ssw_Pars_t *pSVar7;
  Aig_Man_t *pAVar8;
  char *pcVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  Ssw_Cla_t *pSVar15;
  Ssw_Man_t *pSVar16;
  int iVar17;
  long lVar18;
  int local_54;
  timespec ts;
  int local_3c;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pSVar15 = p->ppClasses;
  iVar2 = Ssw_ClassesLitNum(pSVar15);
  iVar1 = (int)pSVar15;
  p->nLitsBeg = iVar2;
  pSVar7 = p->pPars;
  pAVar8 = p->pAig;
  p->nNodesBeg = pAVar8->nObjs[6] + pAVar8->nObjs[5];
  p->nRegsBeg = pAVar8->nRegs;
  if (pSVar7->fVerbose != 0) {
    Abc_Print(iVar1,"Before BMC: ");
    pSVar15 = p->ppClasses;
    Ssw_ClassesPrint(pSVar15,0);
    iVar1 = (int)pSVar15;
    pSVar7 = p->pPars;
  }
  if ((pSVar7->fLatchCorr == 0) || (1 < pSVar7->nFramesK)) {
    pSVar6 = Ssw_SatStart(0);
    p->pMSat = pSVar6;
    if (p->pPars->fConstrs == 0) {
      Ssw_ManSweepBmc(p);
    }
    else {
      Ssw_ManSweepBmcConstr(p);
    }
    Ssw_SatStop(p->pMSat);
    p->pMSat = (Ssw_Sat_t *)0x0;
    pSVar16 = p;
    Ssw_ManCleanup(p);
    iVar1 = (int)pSVar16;
    pSVar7 = p->pPars;
  }
  if (pSVar7->fVerbose != 0) {
    Abc_Print(iVar1,"After  BMC: ");
    pSVar15 = p->ppClasses;
    Ssw_ClassesPrint(pSVar15,0);
    iVar1 = (int)pSVar15;
    pSVar7 = p->pPars;
  }
  if ((code *)pSVar7->pFunc != (code *)0x0) {
    (*(code *)pSVar7->pFunc)(pSVar7->pData);
    iVar1 = (int)p->pPars->pData;
    (*(code *)p->pPars->pFunc)();
    pSVar7 = p->pPars;
  }
  if (pSVar7->nStepsMax == 0) {
    Abc_Print(iVar1,"Stopped signal correspondence after BMC.\n");
    uVar13 = 0xffffffff;
  }
  else {
    iVar1 = 0;
    iVar2 = 0;
    uVar13 = 0;
    local_54 = 0;
    iVar17 = 0;
    do {
      if (uVar13 == pSVar7->nItersStop && -1 < pSVar7->nItersStop) {
        pAVar8 = Ssw_SpeculativeReduction(p);
        Aig_ManDumpBlif(pAVar8,"srm.blif",(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
        Aig_ManStop(pAVar8);
        iVar1 = (int)pAVar8;
        Abc_Print(iVar1,"Iterative refinement is stopped before iteration %d.\n",(ulong)uVar13);
        Abc_Print(iVar1,"The network is reduced using candidate equivalences.\n");
        Abc_Print(iVar1,"Speculatively reduced miter is saved in file \"%s\".\n","srm.blif");
        Abc_Print(iVar1,"If the miter is SAT, the reduced result is incorrect.\n");
        goto LAB_006ab7b1;
      }
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pSVar6 = Ssw_SatStart(0);
      p->pMSat = pSVar6;
      pSVar7 = p->pPars;
      if (pSVar7->fLatchCorrOpt == 0) {
        if (pSVar7->fConstrs == 0) {
          if (pSVar7->fDynamic == 0) {
            local_3c = Ssw_ManSweep(p);
          }
          else {
            local_3c = Ssw_ManSweepDyn(p);
          }
        }
        else {
          local_3c = Ssw_ManSweepConstr(p);
        }
        pSVar7 = p->pPars;
        pSVar7->nConflicts = pSVar7->nConflicts + (int)(p->pMSat->pSat->stats).conflicts;
        if (pSVar7->fVerbose != 0) {
          uVar4 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar5 = Ssw_ClassesClassNum(p->ppClasses);
          uVar14 = p->pFrames->nObjs[6] + p->pFrames->nObjs[5];
          Abc_Print(uVar14,"%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",(ulong)uVar13,(ulong)uVar4,
                    (ulong)uVar5,(ulong)(uint)p->nConstrReduced,(ulong)uVar14);
          if (p->pPars->fDynamic != 0) {
            Abc_Print(uVar14,"Cex =%5d. ",(ulong)(uint)(p->nSatCallsSat - iVar2));
            Abc_Print(uVar14,"R =%4d. ",(ulong)(uint)(p->nRecycles - local_54));
          }
          pAVar8 = p->pAig;
          pcVar9 = "-";
          if (pAVar8->nTruePos == 1) {
            if (pAVar8->vCos->nSize < 1) goto LAB_006ab8fa;
            if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar10 = pAVar8->pReprs
                        [*(int *)((*(ulong *)((long)*pAVar8->vCos->pArray + 8) & 0xfffffffffffffffe)
                                 + 0x24)];
            }
            pcVar9 = "+";
            if (pAVar10 != pAVar8->pConst1) {
              pcVar9 = "-";
            }
          }
          Abc_Print(uVar14,"F =%5d. %s ",(ulong)(uint)(p->nSatFailsReal - iVar17),pcVar9);
          Abc_Print(uVar14,"%s =","T");
          iVar2 = 3;
          iVar1 = clock_gettime(3,(timespec *)&ts);
          if (iVar1 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar12 - lVar18) / 1000000.0);
          pSVar7 = p->pPars;
        }
        if ((pSVar7->fStopWhenGone != 0) && (pAVar8 = p->pAig, pAVar8->nTruePos == 1)) {
          if (pAVar8->vCos->nSize < 1) {
LAB_006ab8fa:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = pAVar8->pReprs
                      [*(int *)((*(ulong *)((long)*pAVar8->vCos->pArray + 8) & 0xfffffffffffffffe) +
                               0x24)];
          }
          if (pAVar10 != pAVar8->pConst1) {
            printf("Iterative refinement is stopped after iteration %d\n",(ulong)uVar13);
            puts("because the property output is no longer a candidate constant.");
            p->nLitsEnd = p->nLitsBeg;
            p->nNodesEnd = p->nNodesBeg;
            p->nRegsEnd = p->nRegsBeg;
            Ssw_SatStop(p->pMSat);
            p->pMSat = (Ssw_Sat_t *)0x0;
            Ssw_ManCleanup(p);
            Aig_ManSetPhase(p->pAig);
            Aig_ManCleanMarkB(p->pAig);
            pAVar8 = Aig_ManDupSimple(p->pAig);
            return pAVar8;
          }
        }
      }
      else {
        local_3c = Ssw_ManSweepLatch(p);
        if (p->pPars->fVerbose != 0) {
          uVar4 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar5 = Ssw_ClassesClassNum(p->ppClasses);
          uVar14 = p->nRecycles - local_54;
          Abc_Print(uVar14,"%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    (ulong)uVar13,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(p->nSatProof - iVar1),
                    (ulong)(uint)(p->nSatCallsSat - iVar2),(ulong)uVar14,
                    (ulong)(uint)(p->nSatFailsReal - iVar17));
          Abc_Print(uVar14,"%s =","T");
          iVar2 = 3;
          iVar1 = clock_gettime(3,(timespec *)&ts);
          if (iVar1 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar12 - lVar18) / 1000000.0);
        }
      }
      iVar1 = p->nSatProof;
      iVar2 = p->nSatCallsSat;
      local_54 = p->nRecycles;
      pSVar6 = p->pMSat;
      iVar3 = pSVar6->nSatVars;
      if (pSVar6->nSatVars < p->nVarsMax) {
        iVar3 = p->nVarsMax;
      }
      iVar17 = p->nSatFailsReal;
      p->nVarsMax = iVar3;
      iVar3 = pSVar6->nSolverCalls;
      if (pSVar6->nSolverCalls < p->nCallsMax) {
        iVar3 = p->nCallsMax;
      }
      p->nCallsMax = iVar3;
      Ssw_SatStop(pSVar6);
      p->pMSat = (Ssw_Sat_t *)0x0;
      pSVar16 = p;
      Ssw_ManCleanup(p);
      iVar3 = (int)pSVar16;
      if (local_3c == 0) goto LAB_006ab7b1;
      pSVar7 = p->pPars;
      if ((code *)pSVar7->pFunc != (code *)0x0) {
        iVar3 = (int)pSVar7->pData;
        (*(code *)pSVar7->pFunc)();
        pSVar7 = p->pPars;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != pSVar7->nStepsMax);
    Abc_Print(iVar3,"Stopped signal correspondence after %d refiment iterations.\n",(ulong)uVar13);
  }
LAB_006ab7b1:
  p->pPars->nIters = uVar13 + 1;
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeTotal = lVar18 + lVar11;
  Ssw_ManUpdateEquivs(p,p->pAig,(int)(lVar18 + lVar11));
  pAVar8 = Aig_ManDupRepr(p->pAig,0);
  Aig_ManSeqCleanup(pAVar8);
  iVar1 = Ssw_ClassesLitNum(p->ppClasses);
  p->nLitsEnd = iVar1;
  p->nNodesEnd = pAVar8->nObjs[6] + pAVar8->nObjs[5];
  p->nRegsEnd = pAVar8->nRegs;
  Aig_ManSetPhase(p->pAig);
  Aig_ManCleanMarkB(p->pAig);
  return pAVar8;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceRefine( Ssw_Man_t * p )
{
    int nSatProof, nSatCallsSat, nRecycles, nSatFailsReal, nUniques;
    Aig_Man_t * pAigNew;
    int RetValue, nIter = -1;
    abctime clk, clkTotal = Abc_Clock();
    // get the starting stats
    p->nLitsBeg  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);
    // refine classes using BMC
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Before BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    if ( !p->pPars->fLatchCorr || p->pPars->nFramesK > 1 )
    {
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fConstrs )
            Ssw_ManSweepBmcConstr( p );
        else
            Ssw_ManSweepBmc( p );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
    }
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "After  BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // apply semi-formal filtering
/*
    if ( p->pPars->fSemiFormal )
    {
        Aig_Man_t * pSRed;
        Ssw_FilterUsingSemi( p, 0, 2000, p->pPars->fVerbose );
//        Ssw_FilterUsingSemi( p, 1, 100000, p->pPars->fVerbose );
        pSRed = Ssw_SpeculativeReduction( p );
        Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
        Aig_ManStop( pSRed );
    }
*/
    if ( p->pPars->pFunc )
    {
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }
    if ( p->pPars->nStepsMax == 0 )
    {
        Abc_Print( 1, "Stopped signal correspondence after BMC.\n" );
        goto finalize;
    }
    // refine classes using induction
    nSatProof = nSatCallsSat = nRecycles = nSatFailsReal = nUniques = 0;
    for ( nIter = 0; ; nIter++ )
    {
        if ( p->pPars->nStepsMax == nIter )
        {
            Abc_Print( 1, "Stopped signal correspondence after %d refiment iterations.\n", nIter );
            goto finalize;
        }
        if ( p->pPars->nItersStop >= 0 && p->pPars->nItersStop == nIter )
        {
            Aig_Man_t * pSRed = Ssw_SpeculativeReduction( p );
            Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
            Aig_ManStop( pSRed );
            Abc_Print( 1, "Iterative refinement is stopped before iteration %d.\n", nIter );
            Abc_Print( 1, "The network is reduced using candidate equivalences.\n" );
            Abc_Print( 1, "Speculatively reduced miter is saved in file \"%s\".\n", "srm.blif" );
            Abc_Print( 1, "If the miter is SAT, the reduced result is incorrect.\n" );
            break;
        }

clk = Abc_Clock();
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fLatchCorrOpt )
        {
            RetValue = Ssw_ManSweepLatch( p );
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nSatProof-nSatProof, p->nSatCallsSat-nSatCallsSat,
                    p->nRecycles-nRecycles, p->nSatFailsReal-nSatFailsReal );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
        }
        else
        {
            if ( p->pPars->fConstrs )
                RetValue = Ssw_ManSweepConstr( p );
            else if ( p->pPars->fDynamic )
                RetValue = Ssw_ManSweepDyn( p );
            else
                RetValue = Ssw_ManSweep( p );

            p->pPars->nConflicts += p->pMSat->pSat->stats.conflicts;
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nConstrReduced, Aig_ManNodeNum(p->pFrames) );
                if ( p->pPars->fDynamic )
                {
                    Abc_Print( 1, "Cex =%5d. ", p->nSatCallsSat-nSatCallsSat );
                    Abc_Print( 1, "R =%4d. ",   p->nRecycles-nRecycles );
                }
                Abc_Print( 1, "F =%5d. %s ", p->nSatFailsReal-nSatFailsReal,
                    (Saig_ManPoNum(p->pAig)==1 && Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))))? "+" : "-" );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
//            if ( p->pPars->fDynamic && p->nSatCallsSat-nSatCallsSat < 100 )
//                p->pPars->nBTLimit = 10000;

            if ( p->pPars->fStopWhenGone && Saig_ManPoNum(p->pAig) == 1 && !Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))) )
            {
                printf( "Iterative refinement is stopped after iteration %d\n", nIter );
                printf( "because the property output is no longer a candidate constant.\n" );
                // prepare to quite
                p->nLitsEnd  = p->nLitsBeg;
                p->nNodesEnd = p->nNodesBeg;
                p->nRegsEnd  = p->nRegsBeg;
                // cleanup
                Ssw_SatStop( p->pMSat );
                p->pMSat = NULL;
                Ssw_ManCleanup( p );
                // cleanup
                Aig_ManSetPhase( p->pAig );
                Aig_ManCleanMarkB( p->pAig );
                return Aig_ManDupSimple( p->pAig );
            }
        }
        nSatProof     = p->nSatProof;
        nSatCallsSat  = p->nSatCallsSat;
        nRecycles     = p->nRecycles;
        nSatFailsReal = p->nSatFailsReal;
        nUniques      = p->nUniques;

        p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
        p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
        if ( !RetValue )
            break;
        if ( p->pPars->pFunc )
            ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }

finalize:
    p->pPars->nIters = nIter + 1;
p->timeTotal = Abc_Clock() - clkTotal;

    Ssw_ManUpdateEquivs( p, p->pAig, p->pPars->fVerbose );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//Ssw_ClassesPrint( p->ppClasses, 1 );
    // get the final stats
    p->nLitsEnd  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
    // cleanup
    Aig_ManSetPhase( p->pAig );
    Aig_ManCleanMarkB( p->pAig );
    return pAigNew;
}